

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::InitMaterialDataT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism> *this,
          map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
          *dataVec,TPZVec<long> *indices)

{
  _Rb_tree_header *p_Var1;
  TPZCompEl *pTVar2;
  long lVar3;
  int *piVar4;
  TPZGeoEl *pTVar5;
  mapped_type *pmVar6;
  long *plVar7;
  _Rb_tree_node_base *p_Var8;
  undefined8 uVar9;
  int64_t iVar10;
  long lVar11;
  long lVar12;
  map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
  *__range2;
  TPZVec<int> nshape;
  key_type local_6c;
  map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
  *local_68;
  int64_t local_60;
  TPZVec<int> local_58;
  int64_t local_38;
  
  iVar10 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  local_68 = dataVec;
  local_60 = iVar10;
  if (indices == (TPZVec<long> *)0x0) {
    TPZVec<int>::TPZVec(&local_58,iVar10);
    if (0 < iVar10) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pTVar2 = *(TPZCompEl **)
                  ((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar11);
        if (pTVar2 != (TPZCompEl *)0x0) {
          pTVar5 = TPZCompEl::Reference(pTVar2);
          iVar10 = pTVar5->fId;
          local_6c = (key_type)lVar12;
          pmVar6 = std::
                   map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                   ::operator[](local_68,&local_6c);
          (pmVar6->super_TPZMaterialData).gelElId = (int)iVar10;
          iVar10 = local_60;
        }
        lVar3 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                         lVar11);
        if (lVar3 == 0) {
          plVar7 = (long *)0x0;
        }
        else {
          plVar7 = (long *)__dynamic_cast(lVar3,&TPZCompEl::typeinfo,
                                          &TPZInterpolationSpace::typeinfo,0);
        }
        if (plVar7 != (long *)0x0) {
          local_6c = (key_type)lVar12;
          pmVar6 = std::
                   map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                   ::operator[](local_68,&local_6c);
          (**(code **)(*plVar7 + 0x298))(plVar7,pmVar6);
        }
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x10;
      } while (iVar10 != lVar12);
    }
    local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_58.fStore != (int *)0x0) {
      operator_delete__(local_58.fStore);
    }
  }
  else {
    iVar10 = indices->fNElements;
    TPZVec<int>::TPZVec(&local_58,iVar10);
    local_38 = iVar10;
    if (0 < iVar10) {
      lVar11 = 0;
      do {
        lVar12 = indices->fStore[lVar11];
        pTVar2 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore[lVar12].fEl;
        if (pTVar2 != (TPZCompEl *)0x0) {
          pTVar5 = TPZCompEl::Reference(pTVar2);
          iVar10 = pTVar5->fId;
          local_6c = (key_type)lVar12;
          pmVar6 = std::
                   map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                   ::operator[](local_68,&local_6c);
          (pmVar6->super_TPZMaterialData).gelElId = (int)iVar10;
        }
        pTVar2 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore[lVar12].fEl;
        if (pTVar2 == (TPZCompEl *)0x0) {
          plVar7 = (long *)0x0;
        }
        else {
          plVar7 = (long *)__dynamic_cast(pTVar2,&TPZCompEl::typeinfo,
                                          &TPZInterpolationSpace::typeinfo,0);
        }
        if (plVar7 != (long *)0x0) {
          local_6c = (key_type)lVar12;
          pmVar6 = std::
                   map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                   ::operator[](local_68,&local_6c);
          (**(code **)(*plVar7 + 0x298))(plVar7,pmVar6);
        }
        lVar11 = lVar11 + 1;
      } while (local_38 != lVar11);
    }
    local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    iVar10 = local_60;
    if (local_58.fStore != (int *)0x0) {
      operator_delete__(local_58.fStore);
      iVar10 = local_60;
    }
  }
  if ((int)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.super_TPZVec<int>.fNElements == 0
     ) {
    local_58._vptr_TPZVec = (_func_int **)CONCAT44(local_58._vptr_TPZVec._4_4_,1);
    TPZManVector<int,_5>::Resize
              (&(this->super_TPZMultiphysicsElement).fActiveApproxSpace,iVar10,(int *)&local_58);
  }
  p_Var8 = (local_68->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_68->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    piVar4 = (this->super_TPZMultiphysicsElement).fActiveApproxSpace.super_TPZVec<int>.fStore;
    do {
      p_Var8[0x1c9].field_0x6 = piVar4[(int)p_Var8[1]._M_color] != 0;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  uVar9 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  plVar7 = (long *)__dynamic_cast(uVar9,&TPZMaterial::typeinfo,
                                  &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe);
  (**(code **)(*plVar7 + 0x58))(plVar7,local_68);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitMaterialDataT(std::map<int, TPZMaterialDataT<TVar> > &dataVec, TPZVec<int64_t> *indices)
{
    int64_t nref = this->fElementVec.size();
    
//#ifdef PZDEBUG
//    if (nref != dataVec.size()) {
//        PZError << "Error at " << __PRETTY_FUNCTION__ << " The number of materials can not be different from the size of the fElementVec !\n";
//        DebugStop();
//    }
//#endif
    if(indices){
        int64_t nindices = indices->size();
        TPZVec<int> nshape(nindices);
        for (int64_t iref = 0; iref <nindices; iref++) {
            int64_t indiciref = indices->operator[](iref);
            if(fElementVec[indiciref])
            {
                dataVec[indiciref].gelElId = fElementVec[indiciref].Element()->Reference()->Id();
            }
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[indiciref].Element());
            if (!msp) {
                continue;
            }
            // precisa comentar essa parte se for calcular os vetores no pontos de integracao.
            msp->InitMaterialData(dataVec[indiciref]);
        }
    }else{
        TPZVec<int> nshape(nref);
        for (int64_t iref = 0; iref < nref; iref++)
        {
            if(fElementVec[iref])
            {
                dataVec[iref].gelElId = fElementVec[iref].Element()->Reference()->Id();
            }
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
            if (!msp) {
                continue;
            }
            // precisa comentar essa parte se for calcular os vetores no pontos de integracao.
            msp->InitMaterialData(dataVec[iref]);
        }
    }
    
    int n_active_approx_spaces = fActiveApproxSpace.size();
    if (n_active_approx_spaces == 0) { /// it preserves the integrity for old version of multiphycis codes.
        fActiveApproxSpace.Resize(nref, 1);
    }
    
    for (auto &it : dataVec) {
        it.second.fActiveApproxSpace = fActiveApproxSpace[it.first];
    }
    auto * mat =
        dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(this->Material());
    mat->FillDataRequirements(dataVec);
    
}